

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapSunflower(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = (*l->p->getMap)(l->p,out,x,z,w,h);
  if (iVar3 == 0) {
    if (0 < h) {
      uVar1 = l->startSeed;
      lVar7 = 0;
      do {
        if (0 < w) {
          lVar6 = (long)(z + (int)lVar7);
          lVar8 = 0;
          do {
            if ((out[lVar8] == 1) &&
               (lVar4 = (long)(x + (int)lVar8), lVar5 = uVar1 + lVar4,
               lVar5 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5 + lVar6,
               lVar4 = (lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar5 + lVar4,
               lVar5 = (lVar4 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar4 + lVar6,
               auVar2._8_8_ = lVar5 >> 0x3f, auVar2._0_8_ = lVar5 >> 0x18,
               SUB168(auVar2 % SEXT816(0x39),0) == 0)) {
              out[lVar8] = 0x81;
            }
            lVar8 = lVar8 + 1;
          } while (w != lVar8);
        }
        lVar7 = lVar7 + 1;
        out = out + w;
      } while (lVar7 != h);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mapSunflower(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v = out[i + j * w];

            if (v == plains)
            {
                cs = getChunkSeed(ss, i + x, j + z);
                if (mcFirstIsZero(cs, 57))
                {
                    out[i + j*w] = sunflower_plains;
                }
            }
        }
    }

    return 0;
}